

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O2

SQHash HashObj(SQObject *key)

{
  SQObjectType SVar1;
  
  SVar1 = key->_type;
  if ((SVar1 == OT_BOOL) || (SVar1 == OT_INTEGER)) {
    return (SQHash)(key->_unVal).pTable;
  }
  if (SVar1 == OT_FLOAT) {
    return (long)(key->_unVal).fFloat;
  }
  if (SVar1 == OT_STRING) {
    return (SQHash)(((key->_unVal).pTable)->super_SQDelegable)._delegate;
  }
  return (key->_unVal).nInteger >> 3;
}

Assistant:

inline SQHash HashObj(const SQObject &key)
{
    switch(sq_type(key)) {
        case OT_STRING:     return _string(key)->_hash;
        case OT_FLOAT:      return (SQHash)((SQInteger)_float(key));
        case OT_BOOL: case OT_INTEGER:  return (SQHash)((SQInteger)_integer(key));
        default:            return hashptr(key._unVal.pRefCounted);
    }
}